

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O2

boolean breaktest(obj *obj)

{
  ushort uVar1;
  boolean bVar2;
  
  bVar2 = obj_resists(obj,1,99);
  if ((bVar2 != '\0') ||
     (((((uVar1 = obj->otyp, (*(ushort *)&objects[(short)uVar1].field_0x11 & 0x1f0) != 0x130 ||
         (obj->oartifact != '\0')) || (bVar2 = '\x01', obj->oclass == '\r')) &&
       ((bVar2 = '\x01', obj->oclass != '\b' &&
        ((0x36 < uVar1 - 0xea || ((0x40802000000001U >> ((ulong)(uVar1 - 0xea) & 0x3f) & 1) == 0))))
       )) && ((1 < uVar1 - 0x218 && (uVar1 != 0x14f)))))) {
    bVar2 = '\0';
  }
  return bVar2;
}

Assistant:

boolean breaktest(struct obj *obj)
{
	if (obj_resists(obj, 1, 99)) return 0;
	if (objects[obj->otyp].oc_material == GLASS && !obj->oartifact &&
		obj->oclass != GEM_CLASS)
	    return 1;
	switch (obj->oclass == POTION_CLASS ? POT_WATER : obj->otyp) {
		case EXPENSIVE_CAMERA:
		case POT_WATER:		/* really, all potions */
		case EGG:
		case CREAM_PIE:
		case MELON:
		case ACID_VENOM:
		case BLINDING_VENOM:
			return 1;
		default:
			return 0;
	}
}